

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendQueryKernelTimestamps
          (ze_command_list_handle_t hCommandList,uint32_t numEvents,ze_event_handle_t *phEvents,
          void *dstptr,size_t *pOffsets,ze_event_handle_t hSignalEvent,uint32_t numWaitEvents,
          ze_event_handle_t *phWaitEvents)

{
  ze_pfnCommandListAppendQueryKernelTimestamps_t pfnAppendQueryKernelTimestamps;
  ze_result_t result;
  ze_event_handle_t hSignalEvent_local;
  size_t *pOffsets_local;
  void *dstptr_local;
  ze_event_handle_t *phEvents_local;
  uint32_t numEvents_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendQueryKernelTimestamps._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c3f0 != (code *)0x0) {
    pfnAppendQueryKernelTimestamps._4_4_ =
         (*DAT_0011c3f0)(hCommandList,numEvents,phEvents,dstptr,pOffsets,hSignalEvent,numWaitEvents,
                         phWaitEvents);
  }
  return pfnAppendQueryKernelTimestamps._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendQueryKernelTimestamps(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numEvents,                             ///< [in] the number of timestamp events to query
        ze_event_handle_t* phEvents,                    ///< [in][range(0, numEvents)] handles of timestamp events to query
        void* dstptr,                                   ///< [in,out] pointer to memory where ::ze_kernel_timestamp_result_t will
                                                        ///< be written; must be size-aligned.
        const size_t* pOffsets,                         ///< [in][optional][range(0, numEvents)] offset, in bytes, to write
                                                        ///< results; address must be 4byte-aligned and offsets must be
                                                        ///< size-aligned.
        ze_event_handle_t hSignalEvent,                 ///< [in][optional] handle of the event to signal on completion
        uint32_t numWaitEvents,                         ///< [in][optional] number of events to wait on before executing query;
                                                        ///< must be 0 if `nullptr == phWaitEvents`
        ze_event_handle_t* phWaitEvents                 ///< [in][optional][range(0, numWaitEvents)] handle of the events to wait
                                                        ///< on before executing query
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendQueryKernelTimestamps = context.zeDdiTable.CommandList.pfnAppendQueryKernelTimestamps;
        if( nullptr != pfnAppendQueryKernelTimestamps )
        {
            result = pfnAppendQueryKernelTimestamps( hCommandList, numEvents, phEvents, dstptr, pOffsets, hSignalEvent, numWaitEvents, phWaitEvents );
        }
        else
        {
            // generic implementation
        }

        return result;
    }